

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_rust.cpp
# Opt level: O0

string * __thiscall
flatbuffers::rust::RustGenerator::FollowType
          (string *__return_storage_ptr__,RustGenerator *this,Type *type,string *lifetime)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr___00;
  FullType FVar1;
  allocator<char> local_459;
  string local_458;
  Type local_438;
  undefined1 local_418 [8];
  string typname_7;
  undefined1 local_3d8 [8];
  string typname_6;
  Type local_398;
  undefined1 local_378 [8];
  string typname_5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  string local_318;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  string local_298;
  undefined1 local_278 [8];
  string typname_4;
  string local_238;
  undefined1 local_218 [8];
  string typname_3;
  string local_1d8;
  Type local_1b8;
  undefined1 local_198 [8];
  string typname_2;
  string local_158;
  Type local_138;
  undefined1 local_118 [8];
  string typname_1;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_80;
  undefined1 local_60 [8];
  string typname;
  anon_class_8_1_212d4947 WrapArray;
  anon_class_8_1_212d4947 WrapVector;
  anon_class_1_0_00000001 WrapForwardsUOffset;
  string *lifetime_local;
  Type *type_local;
  RustGenerator *this_local;
  
  typname.field_2._8_8_ = lifetime;
  WrapArray.lifetime = lifetime;
  FVar1 = anon_unknown_26::GetFullType(type);
  switch(FVar1) {
  case ftInteger:
  case ftFloat:
  case ftBool:
    GetTypeBasic_abi_cxx11_(__return_storage_ptr__,this,type);
    break;
  case ftStruct:
    WrapInNameSpace_abi_cxx11_(__return_storage_ptr__,this,&type->struct_def->super_Definition);
    break;
  case ftTable:
    WrapInNameSpace_abi_cxx11_((string *)local_60,this,&type->struct_def->super_Definition);
    std::__cxx11::string::string((string *)&local_80,(string *)local_60);
    FollowType(flatbuffers::Type_const&,std::__cxx11::string_const&)::
    {lambda(std::__cxx11::string)#1}::operator()::string__const
              (__return_storage_ptr__,(void *)((long)&WrapVector.lifetime + 7),&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)local_60);
    break;
  case ftEnumKey:
  case ftUnionKey:
    WrapInNameSpace_abi_cxx11_(__return_storage_ptr__,this,&type->enum_def->super_Definition);
    break;
  case ftUnionValue:
    std::operator+(&local_d0,"flatbuffers::Table<",lifetime);
    std::operator+(&local_b0,&local_d0,">");
    FollowType(flatbuffers::Type_const&,std::__cxx11::string_const&)::
    {lambda(std::__cxx11::string)#1}::operator()::string__const
              (__return_storage_ptr__,(void *)((long)&WrapVector.lifetime + 7),&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    break;
  case ftString:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f0,"&str",(allocator<char> *)(typname_1.field_2._M_local_buf + 0xf))
    ;
    FollowType(flatbuffers::Type_const&,std::__cxx11::string_const&)::
    {lambda(std::__cxx11::string)#1}::operator()::string__const
              (__return_storage_ptr__,(void *)((long)&WrapVector.lifetime + 7),&local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::allocator<char>::~allocator((allocator<char> *)(typname_1.field_2._M_local_buf + 0xf));
    break;
  case ftVectorOfInteger:
  case ftVectorOfFloat:
  case ftVectorOfBool:
    Type::VectorType(&local_138,type);
    GetTypeBasic_abi_cxx11_((string *)local_118,this,&local_138);
    std::__cxx11::string::string((string *)(typname_2.field_2._M_local_buf + 8),(string *)local_118)
    ;
    FollowType(flatbuffers::Type_const&,std::__cxx11::string_const&)::
    {lambda(std::__cxx11::string)#2}::operator()::string__const
              (&local_158,&WrapArray,(string *)((long)&typname_2.field_2 + 8));
    FollowType(flatbuffers::Type_const&,std::__cxx11::string_const&)::
    {lambda(std::__cxx11::string)#1}::operator()::string__const
              (__return_storage_ptr__,(void *)((long)&WrapVector.lifetime + 7),&local_158);
    std::__cxx11::string::~string((string *)&local_158);
    std::__cxx11::string::~string((string *)(typname_2.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_118);
    break;
  case ftVectorOfEnumKey:
    Type::VectorType(&local_1b8,type);
    WrapInNameSpace_abi_cxx11_((string *)local_198,this,&(local_1b8.enum_def)->super_Definition);
    std::__cxx11::string::string((string *)(typname_3.field_2._M_local_buf + 8),(string *)local_198)
    ;
    FollowType(flatbuffers::Type_const&,std::__cxx11::string_const&)::
    {lambda(std::__cxx11::string)#2}::operator()::string__const
              (&local_1d8,&WrapArray,(string *)((long)&typname_3.field_2 + 8));
    FollowType(flatbuffers::Type_const&,std::__cxx11::string_const&)::
    {lambda(std::__cxx11::string)#1}::operator()::string__const
              (__return_storage_ptr__,(void *)((long)&WrapVector.lifetime + 7),&local_1d8);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::~string((string *)(typname_3.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_198);
    break;
  case ftVectorOfStruct:
    WrapInNameSpace_abi_cxx11_((string *)local_218,this,&type->struct_def->super_Definition);
    std::__cxx11::string::string((string *)(typname_4.field_2._M_local_buf + 8),(string *)local_218)
    ;
    FollowType(flatbuffers::Type_const&,std::__cxx11::string_const&)::
    {lambda(std::__cxx11::string)#2}::operator()::string__const
              (&local_238,&WrapArray,(string *)((long)&typname_4.field_2 + 8));
    FollowType(flatbuffers::Type_const&,std::__cxx11::string_const&)::
    {lambda(std::__cxx11::string)#1}::operator()::string__const
              (__return_storage_ptr__,(void *)((long)&WrapVector.lifetime + 7),&local_238);
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::string::~string((string *)(typname_4.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_218);
    break;
  case ftVectorOfTable:
    WrapInNameSpace_abi_cxx11_((string *)local_278,this,&type->struct_def->super_Definition);
    std::__cxx11::string::string((string *)&local_2d8,(string *)local_278);
    FollowType(flatbuffers::Type_const&,std::__cxx11::string_const&)::
    {lambda(std::__cxx11::string)#1}::operator()::string__const
              (&local_2b8,(void *)((long)&WrapVector.lifetime + 7),&local_2d8);
    FollowType(flatbuffers::Type_const&,std::__cxx11::string_const&)::
    {lambda(std::__cxx11::string)#2}::operator()::string__const(&local_298,&WrapArray,&local_2b8);
    FollowType(flatbuffers::Type_const&,std::__cxx11::string_const&)::
    {lambda(std::__cxx11::string)#1}::operator()::string__const
              (__return_storage_ptr__,(void *)((long)&WrapVector.lifetime + 7),&local_298);
    std::__cxx11::string::~string((string *)&local_298);
    std::__cxx11::string::~string((string *)&local_2b8);
    std::__cxx11::string::~string((string *)&local_2d8);
    std::__cxx11::string::~string((string *)local_278);
    break;
  case ftVectorOfString:
    __return_storage_ptr___00 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ((long)&typname_5.field_2 + 8);
    std::operator+(__return_storage_ptr___00,"&",lifetime);
    std::operator+(&local_338,__return_storage_ptr___00," str");
    FollowType(flatbuffers::Type_const&,std::__cxx11::string_const&)::
    {lambda(std::__cxx11::string)#1}::operator()::string__const
              (&local_318,(void *)((long)&WrapVector.lifetime + 7),&local_338);
    FollowType(flatbuffers::Type_const&,std::__cxx11::string_const&)::
    {lambda(std::__cxx11::string)#2}::operator()::string__const(&local_2f8,&WrapArray,&local_318);
    FollowType(flatbuffers::Type_const&,std::__cxx11::string_const&)::
    {lambda(std::__cxx11::string)#1}::operator()::string__const
              (__return_storage_ptr__,(void *)((long)&WrapVector.lifetime + 7),&local_2f8);
    std::__cxx11::string::~string((string *)&local_2f8);
    std::__cxx11::string::~string((string *)&local_318);
    std::__cxx11::string::~string((string *)&local_338);
    std::__cxx11::string::~string((string *)(typname_5.field_2._M_local_buf + 8));
    break;
  case ftVectorOfUnionValue:
    __assert_fail("false && \"vectors of unions are not yet supported\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_rust.cpp"
                  ,0x626,
                  "std::string flatbuffers::rust::RustGenerator::FollowType(const Type &, const std::string &)"
                 );
  case ftArrayOfBuiltin:
    Type::VectorType(&local_438,type);
    GetTypeBasic_abi_cxx11_((string *)local_418,this,&local_438);
    std::__cxx11::string::string((string *)&local_458,(string *)local_418);
    FollowType(flatbuffers::Type_const&,std::__cxx11::string_const&)::
    {lambda(std::__cxx11::string,unsigned_short)#1}::operator()::string_unsigned_short__const
              (__return_storage_ptr__,(void *)((long)&typname.field_2 + 8),&local_458,
               type->fixed_length);
    std::__cxx11::string::~string((string *)&local_458);
    std::__cxx11::string::~string((string *)local_418);
    break;
  case ftArrayOfEnum:
    Type::VectorType(&local_398,type);
    WrapInNameSpace_abi_cxx11_((string *)local_378,this,&(local_398.enum_def)->super_Definition);
    std::__cxx11::string::string((string *)(typname_6.field_2._M_local_buf + 8),(string *)local_378)
    ;
    FollowType(flatbuffers::Type_const&,std::__cxx11::string_const&)::
    {lambda(std::__cxx11::string,unsigned_short)#1}::operator()::string_unsigned_short__const
              (__return_storage_ptr__,(void *)((long)&typname.field_2 + 8),
               (string *)((long)&typname_6.field_2 + 8),type->fixed_length);
    std::__cxx11::string::~string((string *)(typname_6.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_378);
    break;
  case ftArrayOfStruct:
    WrapInNameSpace_abi_cxx11_((string *)local_3d8,this,&type->struct_def->super_Definition);
    std::__cxx11::string::string((string *)(typname_7.field_2._M_local_buf + 8),(string *)local_3d8)
    ;
    FollowType(flatbuffers::Type_const&,std::__cxx11::string_const&)::
    {lambda(std::__cxx11::string,unsigned_short)#1}::operator()::string_unsigned_short__const
              (__return_storage_ptr__,(void *)((long)&typname.field_2 + 8),
               (string *)((long)&typname_7.field_2 + 8),type->fixed_length);
    std::__cxx11::string::~string((string *)(typname_7.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_3d8);
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"INVALID_CODE_GENERATION",&local_459);
    std::allocator<char>::~allocator(&local_459);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FollowType(const Type &type, const std::string &lifetime) {
    // IsVector... This can be made iterative?

    const auto WrapForwardsUOffset = [](std::string ty) -> std::string {
      return "flatbuffers::ForwardsUOffset<" + ty + ">";
    };
    const auto WrapVector = [&](std::string ty) -> std::string {
      return "flatbuffers::Vector<" + lifetime + ", " + ty + ">";
    };
    const auto WrapArray = [&](std::string ty, uint16_t length) -> std::string {
      return "flatbuffers::Array<" + lifetime + ", " + ty + ", " +
             NumToString(length) + ">";
    };
    switch (GetFullType(type)) {
      case ftInteger:
      case ftFloat:
      case ftBool: {
        return GetTypeBasic(type);
      }
      case ftStruct: {
        return WrapInNameSpace(*type.struct_def);
      }
      case ftUnionKey:
      case ftEnumKey: {
        return WrapInNameSpace(*type.enum_def);
      }
      case ftTable: {
        const auto typname = WrapInNameSpace(*type.struct_def);
        return WrapForwardsUOffset(typname);
      }
      case ftUnionValue: {
        return WrapForwardsUOffset("flatbuffers::Table<" + lifetime + ">");
      }
      case ftString: {
        return WrapForwardsUOffset("&str");
      }
      case ftVectorOfInteger:
      case ftVectorOfBool:
      case ftVectorOfFloat: {
        const auto typname = GetTypeBasic(type.VectorType());
        return WrapForwardsUOffset(WrapVector(typname));
      }
      case ftVectorOfEnumKey: {
        const auto typname = WrapInNameSpace(*type.VectorType().enum_def);
        return WrapForwardsUOffset(WrapVector(typname));
      }
      case ftVectorOfStruct: {
        const auto typname = WrapInNameSpace(*type.struct_def);
        return WrapForwardsUOffset(WrapVector(typname));
      }
      case ftVectorOfTable: {
        const auto typname = WrapInNameSpace(*type.struct_def);
        return WrapForwardsUOffset(WrapVector(WrapForwardsUOffset(typname)));
      }
      case ftVectorOfString: {
        return WrapForwardsUOffset(
            WrapVector(WrapForwardsUOffset("&" + lifetime + " str")));
      }
      case ftVectorOfUnionValue: {
        FLATBUFFERS_ASSERT(false && "vectors of unions are not yet supported");
        return "INVALID_CODE_GENERATION";  // for return analysis
      }
      case ftArrayOfEnum: {
        const auto typname = WrapInNameSpace(*type.VectorType().enum_def);
        return WrapArray(typname, type.fixed_length);
      }
      case ftArrayOfStruct: {
        const auto typname = WrapInNameSpace(*type.struct_def);
        return WrapArray(typname, type.fixed_length);
      }
      case ftArrayOfBuiltin: {
        const auto typname = GetTypeBasic(type.VectorType());
        return WrapArray(typname, type.fixed_length);
      }
    }
    return "INVALID_CODE_GENERATION";  // for return analysis
  }